

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accumulate_suite.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  
  accumulate_null();
  accumulate_null_with_boolean();
  accumulate_boolean();
  accumulate_integer();
  accumulate_real();
  accumulate_string();
  accumulate_wstring();
  accumulate_u16string();
  accumulate_u32string();
  accumulate_array_null();
  accumulate_array_null_with_boolean();
  accumulate_array_boolean();
  accumulate_array_integer();
  accumulate_array_integer_with_real();
  accumulate_array_real();
  accumulate_array_real_with_integer();
  accumulate_array_string();
  accumulate_array_wstring();
  accumulate_array_u16string();
  accumulate_array_u32string();
  accumulate_array_array();
  accumulate_map();
  iVar1 = boost::report_errors();
  return iVar1;
}

Assistant:

int main()
{
    accumulate_null();
    accumulate_null_with_boolean();
    accumulate_boolean();
    accumulate_integer();
    accumulate_real();
    accumulate_string();
    accumulate_wstring();
    accumulate_u16string();
    accumulate_u32string();

    accumulate_array_null();
    accumulate_array_null_with_boolean();
    accumulate_array_boolean();
    accumulate_array_integer();
    accumulate_array_integer_with_real();
    accumulate_array_real();
    accumulate_array_real_with_integer();
    accumulate_array_string();
    accumulate_array_wstring();
    accumulate_array_u16string();
    accumulate_array_u32string();
    accumulate_array_array();

    accumulate_map();

    return boost::report_errors();
}